

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_pcm_u8_to_s24(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  char cVar1;
  ma_uint64 mVar2;
  ma_uint8 *dst_s24;
  char *pcVar3;
  
  if (count != 0) {
    pcVar3 = (char *)((long)dst + 2);
    mVar2 = 0;
    do {
      cVar1 = *(char *)((long)src + mVar2);
      pcVar3[-2] = '\0';
      pcVar3[-1] = '\0';
      *pcVar3 = cVar1 + -0x80;
      mVar2 = mVar2 + 1;
      pcVar3 = pcVar3 + 3;
    } while (count != mVar2);
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_u8_to_s24__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    ma_uint8* dst_s24 = (ma_uint8*)dst;
    const ma_uint8* src_u8 = (const ma_uint8*)src;

    ma_uint64 i;
    for (i = 0; i < count; i += 1) {
        ma_int16 x = src_u8[i];
        x = (ma_int16)(x - 128);

        dst_s24[i*3+0] = 0;
        dst_s24[i*3+1] = 0;
        dst_s24[i*3+2] = (ma_uint8)((ma_int8)x);
    }

    (void)ditherMode;
}